

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TlsReceiverTest::TlsReceiverTest(TlsReceiverTest *this)

{
  AsyncIoProvider *pAVar1;
  Disposer *pDVar2;
  ConnectionReceiver *pCVar3;
  undefined8 uVar4;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Quantity<long,_kj::_::NanosecondLabel>_>_2 aVar5;
  Own<kj::ConnectionReceiver,_std::nullptr_t> OVar6;
  undefined1 local_148 [32];
  anon_union_8_1_a8c68091_for_NullableValue<kj::Quantity<long,_kj::_::NanosecondLabel>_>_2 local_128
  ;
  Options local_120;
  Options local_98;
  
  TlsTest::defaultClient();
  TlsTest::defaultServer();
  TlsTest::TlsTest(&this->super_TlsTest,&local_98,&local_120);
  uVar4 = local_120.acceptErrorHandler.ptr.field_1.value.impl.ptr;
  if ((local_120.acceptErrorHandler.ptr.isSet == true) &&
     (local_120.acceptErrorHandler.ptr.field_1.value.impl.ptr != (Iface *)0x0)) {
    local_120.acceptErrorHandler.ptr.field_1.value.impl.ptr = (Iface *)0x0;
    (**(local_120.acceptErrorHandler.ptr.field_1.value.impl.disposer)->_vptr_Disposer)
              (local_120.acceptErrorHandler.ptr.field_1.value.impl.disposer,
               ((Iface *)uVar4)->_vptr_Iface[-2] + (long)&((Iface *)uVar4)->_vptr_Iface);
  }
  uVar4 = local_98.acceptErrorHandler.ptr.field_1.value.impl.ptr;
  if ((local_98.acceptErrorHandler.ptr.isSet == true) &&
     (local_98.acceptErrorHandler.ptr.field_1.value.impl.ptr != (Iface *)0x0)) {
    local_98.acceptErrorHandler.ptr.field_1.value.impl.ptr = (Iface *)0x0;
    (**(local_98.acceptErrorHandler.ptr.field_1.value.impl.disposer)->_vptr_Disposer)
              (local_98.acceptErrorHandler.ptr.field_1.value.impl.disposer,
               ((Iface *)uVar4)->_vptr_Iface[-2] + (long)&((Iface *)uVar4)->_vptr_Iface);
  }
  (this->receiver).disposer = (Disposer *)0x0;
  (this->receiver).ptr = (ConnectionReceiver *)0x0;
  pAVar1 = (this->super_TlsTest).io.provider.ptr;
  local_128 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Quantity<long,_kj::_::NanosecondLabel>_>_2
               )operator_new(0x40);
  *(undefined ***)local_128 = &PTR_accept_00618e38;
  *(AsyncIoProvider **)((long)local_128 + 8) = pAVar1;
  ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)((long)local_128 + 0x10))->disposer =
       (Disposer *)0x0;
  *(PromiseFulfiller<void> **)((long)local_128 + 0x18) = (PromiseFulfiller<void> *)0x0;
  (((Vector<kj::(anonymous_namespace)::MockConnectionReceiver::ClientRequest> *)
   ((long)local_128 + 0x20))->builder).ptr = (ClientRequest *)0x0;
  *(RemoveConst<kj::(anonymous_namespace)::MockConnectionReceiver::ClientRequest> **)
   ((long)local_128 + 0x28) =
       (RemoveConst<kj::(anonymous_namespace)::MockConnectionReceiver::ClientRequest> *)0x0;
  *(ClientRequest **)((long)local_128 + 0x30) = (ClientRequest *)0x0;
  *(ArrayDisposer **)((long)local_128 + 0x38) = (ArrayDisposer *)&NullArrayDisposer::instance;
  this->baseReceiver = (MockConnectionReceiver *)local_128;
  local_148._24_8_ =
       &kj::_::HeapDisposer<kj::(anonymous_namespace)::MockConnectionReceiver>::instance;
  OVar6 = TlsContext::wrapPort
                    ((TlsContext *)local_148,
                     (Own<kj::ConnectionReceiver,_std::nullptr_t> *)&(this->super_TlsTest).tlsServer
                    );
  pDVar2 = (this->receiver).disposer;
  pCVar3 = (this->receiver).ptr;
  *(undefined4 *)&(this->receiver).disposer = local_148._0_4_;
  *(undefined4 *)((long)&(this->receiver).disposer + 4) = local_148._4_4_;
  *(undefined4 *)&(this->receiver).ptr = local_148._8_4_;
  *(undefined4 *)((long)&(this->receiver).ptr + 4) = local_148._12_4_;
  local_148._8_8_ = (long *)0x0;
  if (pCVar3 != (ConnectionReceiver *)0x0) {
    (**pDVar2->_vptr_Disposer)
              (pDVar2,pCVar3->_vptr_ConnectionReceiver[-2] + (long)&pCVar3->_vptr_ConnectionReceiver
               ,OVar6.ptr);
    uVar4 = local_148._8_8_;
    if ((long *)local_148._8_8_ != (long *)0x0) {
      local_148._8_8_ = (long *)0x0;
      (*(code *)**(undefined8 **)CONCAT44(local_148._4_4_,local_148._0_4_))
                ((undefined8 *)CONCAT44(local_148._4_4_,local_148._0_4_),
                 uVar4 + *(long *)(*(long *)uVar4 + -0x10));
    }
  }
  aVar5 = local_128;
  if (local_128 !=
      (anon_union_8_1_a8c68091_for_NullableValue<kj::Quantity<long,_kj::_::NanosecondLabel>_>_2)0x0)
  {
    local_128 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Quantity<long,_kj::_::NanosecondLabel>_>_2
                 )0x0;
    (*(code *)**(undefined8 **)local_148._24_8_)
              (local_148._24_8_,(long)aVar5 + *(long *)(*(long *)aVar5 + -0x10));
  }
  return;
}

Assistant:

TlsReceiverTest(): TlsTest() {
    auto baseReceiverPtr = kj::heap<MockConnectionReceiver>(*io.provider);
    baseReceiver = baseReceiverPtr.get();
    receiver = tlsServer.wrapPort(kj::mv(baseReceiverPtr));
  }